

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O3

int WI_DrawCharPatch(FFont *font,int charcode,int x,int y,EColorRange translation,bool nomove)

{
  undefined1 uVar1;
  DFrameBuffer *this;
  int iVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  FRemapTable *pFVar3;
  undefined4 in_register_00000034;
  undefined7 in_register_00000089;
  int width;
  
  this = screen;
  iVar2 = (*font->_vptr_FFont[2])(font,CONCAT44(in_register_00000034,charcode),&width);
  uVar1 = (undefined1)gameinfo.gametype & GAME_DoomChex;
  pFVar3 = FFont::GetColorTranslation(font,translation);
  DCanvas::DrawTexture
            ((DCanvas *)this,(FTexture *)CONCAT44(extraout_var,iVar2),(double)x,(double)y,
             (int)CONCAT71(in_register_00000089,nomove) * 3 + 0x40001390,1,0x40001397,
             (ulong)(uVar1 == GAME_Any) << 0xf,0x4000138e,pFVar3,0);
  return extraout_EAX;
}

Assistant:

static int WI_DrawCharPatch (FFont *font, int charcode, int x, int y, EColorRange translation=CR_UNTRANSLATED, bool nomove=false)
{
	int width;
	screen->DrawTexture(font->GetChar(charcode, &width), x, y,
		nomove ? DTA_CleanNoMove : DTA_Clean, true,
		DTA_ShadowAlpha, (gameinfo.gametype & GAME_DoomChex) ? 0 : OPAQUE/2,
		DTA_Translation, font->GetColorTranslation(translation),
		TAG_DONE);
	return x - width;
}